

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O2

int test_ipcmsg_testresults(ITesting *t)

{
  bool bVar1;
  __type_conflict4 _Var2;
  kTRContinueMode kVar3;
  int iVar4;
  Ref tr;
  UTest_IPC_VectorWriter vectorWriter;
  IPCBufferedWriter bufferedWriter;
  IPCTestResults testResultsOut;
  IPCTestResults testResultsIn;
  IPCBinaryEncoder encoder;
  IPCBinaryDecoder decoder;
  UTest_IPC_VectorReader vectorReader;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testResultsOut,"test_module_case",(allocator<char> *)&testResultsIn);
  trun::TestResult::Create((string *)&tr);
  std::__cxx11::string::~string((string *)&testResultsOut);
  (tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult =
       kTestResult_Pass;
  gnilk::IPCTestResults::IPCTestResults(&testResultsOut,&tr);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&testResultsOut.symbolName,"test_module_case");
  vectorWriter.super_IPCWriter._vptr_IPCWriter = (_func_int **)&PTR_Write_0023c8d8;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter(&bufferedWriter,&vectorWriter.super_IPCWriter);
  encoder._0_8_ = &PTR_Write_0023cef8;
  encoder.writer = &bufferedWriter.super_IPCWriter;
  bVar1 = gnilk::IPCTestResults::Marshal(&testResultsOut,&encoder.super_IPCEncoderBase);
  iVar4 = 0x10;
  if (!bVar1) {
    kVar3 = (*t->AssertError)(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"testResultsOut.Marshal(encoder)");
    if (kVar3 == kTRLeave) goto LAB_00181b9c;
  }
  gnilk::IPCBufferedWriter::Flush(&bufferedWriter);
  if (vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    kVar3 = (*t->AssertError)(0x4b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"!vectorWriter.Data().empty()");
    if (kVar3 == kTRLeave) goto LAB_00181b9c;
  }
  decoder.reader = &vectorReader.super_IPCReader;
  vectorReader.super_IPCReader._vptr_IPCReader = (_func_int **)&PTR_Read_0023c928;
  vectorReader.idx = 0;
  decoder.deserializer = &testResultsIn.super_IPCDeserializer;
  testResultsIn.super_IPCSerializer._vptr_IPCSerializer =
       (_func_int **)&PTR__IPCTestResults_0023d080;
  testResultsIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCTestResults_0023d0b8;
  testResultsIn.symbolName._M_dataplus._M_p = (pointer)&testResultsIn.symbolName.field_2;
  testResultsIn.symbolName._M_string_length = 0;
  testResultsIn.symbolName.field_2._M_local_buf[0] = '\0';
  testResultsIn.testResult.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  testResultsIn.testResult.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  testResultsIn.assertError._vptr_AssertError = (_func_int **)&PTR__AssertError_0023c770;
  vectorReader.data = &vectorWriter.data;
  testResultsIn.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testResultsIn.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testResultsIn.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  decoder.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_0023ce28;
  bVar1 = gnilk::IPCBinaryDecoder::Process(&decoder);
  if (bVar1) {
LAB_00181b5c:
    _Var2 = std::operator==(&testResultsIn.symbolName,&testResultsOut.symbolName);
    if (!_Var2) {
      kVar3 = (*t->AssertError)(0x54,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"testResultsIn.symbolName == testResultsOut.symbolName");
      if (kVar3 == kTRLeave) goto LAB_00181b8c;
    }
    iVar4 = 0;
  }
  else {
    kVar3 = (*t->AssertError)(0x52,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"decoder.Process()");
    if (kVar3 != kTRLeave) goto LAB_00181b5c;
LAB_00181b8c:
    iVar4 = 0x10;
  }
  gnilk::IPCTestResults::~IPCTestResults(&testResultsIn);
LAB_00181b9c:
  gnilk::IPCBufferedWriter::~IPCBufferedWriter(&bufferedWriter);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter(&vectorWriter);
  gnilk::IPCTestResults::~IPCTestResults(&testResultsOut);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return iVar4;
}

Assistant:

DLL_EXPORT int test_ipcmsg_testresults(ITesting *t) {

    auto tr = trun::TestResult::Create("test_module_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);

    gnilk::IPCTestResults testResultsOut(tr);
    testResultsOut.symbolName = "test_module_case";

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, testResultsOut.Marshal(encoder));

    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCTestResults testResultsIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, testResultsIn);

    TR_ASSERT(t, decoder.Process());

    TR_ASSERT(t, testResultsIn.symbolName == testResultsOut.symbolName);

    return kTR_Pass;
}